

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::DatePartFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  pointer function;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  undefined4 in_stack_fffffffffffff144;
  undefined4 in_stack_fffffffffffff14c;
  FunctionNullHandling in_stack_fffffffffffff158;
  allocator_type local_ea1;
  bind_lambda_function_t in_stack_fffffffffffff160;
  LogicalType local_e88;
  scalar_function_t local_e70;
  scalar_function_t local_e50;
  scalar_function_t local_e30;
  scalar_function_t local_e10;
  scalar_function_t local_df0;
  LogicalType local_dd0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_db8;
  LogicalType local_da0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d88;
  LogicalType local_d70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d58;
  LogicalType local_d40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d28;
  LogicalType local_d10;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_cf8;
  LogicalType local_ce0;
  LogicalType local_cc8;
  LogicalType local_cb0;
  LogicalType local_c98;
  LogicalType local_c80;
  ScalarFunction local_c68;
  ScalarFunction local_b40;
  ScalarFunction local_a18;
  ScalarFunction local_8f0;
  ScalarFunction local_7c8;
  ScalarFunction local_6a0;
  ScalarFunction local_578;
  ScalarFunction local_450;
  ScalarFunction local_328;
  ScalarFunction local_200;
  BaseScalarFunction local_d8;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,VARCHAR);
  LogicalType::LogicalType(&local_e88,DATE);
  __l._M_len = 2;
  __l._M_array = (iterator)&stack0xfffffffffffff160;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_cf8,__l,&local_ea1);
  LogicalType::LogicalType(&local_d10,BIGINT);
  local_df0.super__Function_base._M_functor._8_8_ = 0;
  local_df0.super__Function_base._M_functor._M_unused._M_object = DatePartFunction<duckdb::date_t>;
  local_df0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_df0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_c80,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_c80;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff144;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff14c;
  ScalarFunction::ScalarFunction
            (&local_200,(vector<duckdb::LogicalType,_true> *)&local_cf8,&local_d10,&local_df0,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff158,
             in_stack_fffffffffffff160);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_200);
  ScalarFunction::~ScalarFunction(&local_200);
  LogicalType::~LogicalType(&local_c80);
  ::std::_Function_base::~_Function_base(&local_df0.super__Function_base);
  LogicalType::~LogicalType(&local_d10);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_cf8);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff160 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,VARCHAR);
  LogicalType::LogicalType(&local_e88,TIMESTAMP);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&stack0xfffffffffffff160;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d28,__l_00,&local_ea1);
  LogicalType::LogicalType(&local_d40,BIGINT);
  local_e10.super__Function_base._M_functor._8_8_ = 0;
  local_e10.super__Function_base._M_functor._M_unused._M_object =
       DatePartFunction<duckdb::timestamp_t>;
  local_e10._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e10.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_c98,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_c98;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff144;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff14c;
  ScalarFunction::ScalarFunction
            (&local_328,(vector<duckdb::LogicalType,_true> *)&local_d28,&local_d40,&local_e10,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff158,
             in_stack_fffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_328);
  ScalarFunction::~ScalarFunction(&local_328);
  LogicalType::~LogicalType(&local_c98);
  ::std::_Function_base::~_Function_base(&local_e10.super__Function_base);
  LogicalType::~LogicalType(&local_d40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d28);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff160 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,VARCHAR);
  LogicalType::LogicalType(&local_e88,TIME);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&stack0xfffffffffffff160;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d58,__l_01,&local_ea1);
  LogicalType::LogicalType(&local_d70,BIGINT);
  local_e30.super__Function_base._M_functor._8_8_ = 0;
  local_e30.super__Function_base._M_functor._M_unused._M_object = DatePartFunction<duckdb::dtime_t>;
  local_e30._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e30.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_cb0,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_cb0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff144;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff14c;
  ScalarFunction::ScalarFunction
            (&local_450,(vector<duckdb::LogicalType,_true> *)&local_d58,&local_d70,&local_e30,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff158,
             in_stack_fffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_450);
  ScalarFunction::~ScalarFunction(&local_450);
  LogicalType::~LogicalType(&local_cb0);
  ::std::_Function_base::~_Function_base(&local_e30.super__Function_base);
  LogicalType::~LogicalType(&local_d70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d58);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff160 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,VARCHAR);
  LogicalType::LogicalType(&local_e88,INTERVAL);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&stack0xfffffffffffff160;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_d88,__l_02,&local_ea1);
  LogicalType::LogicalType(&local_da0,BIGINT);
  local_e50.super__Function_base._M_functor._8_8_ = 0;
  local_e50.super__Function_base._M_functor._M_unused._M_object =
       DatePartFunction<duckdb::interval_t>;
  local_e50._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e50.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_cc8,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_cc8;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff144;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff14c;
  ScalarFunction::ScalarFunction
            (&local_578,(vector<duckdb::LogicalType,_true> *)&local_d88,&local_da0,&local_e50,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_02,CONSISTENT,in_stack_fffffffffffff158,
             in_stack_fffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_578);
  ScalarFunction::~ScalarFunction(&local_578);
  LogicalType::~LogicalType(&local_cc8);
  ::std::_Function_base::~_Function_base(&local_e50.super__Function_base);
  LogicalType::~LogicalType(&local_da0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d88);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff160 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,VARCHAR);
  LogicalType::LogicalType(&local_e88,TIME_TZ);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&stack0xfffffffffffff160;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_db8,__l_03,&local_ea1);
  LogicalType::LogicalType(&local_dd0,BIGINT);
  local_e70.super__Function_base._M_functor._8_8_ = 0;
  local_e70.super__Function_base._M_functor._M_unused._M_object =
       DatePartFunction<duckdb::dtime_tz_t>;
  local_e70._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e70.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_ce0,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_ce0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff144;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff14c;
  ScalarFunction::ScalarFunction
            (&local_6a0,(vector<duckdb::LogicalType,_true> *)&local_db8,&local_dd0,&local_e70,
             DatePartBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_03,CONSISTENT,in_stack_fffffffffffff158,
             in_stack_fffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_6a0);
  ScalarFunction::~ScalarFunction(&local_6a0);
  LogicalType::~LogicalType(&local_ce0);
  ::std::_Function_base::~_Function_base(&local_e70.super__Function_base);
  LogicalType::~LogicalType(&local_dd0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_db8);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&stack0xfffffffffffff160 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,DATE);
  StructDatePart::GetFunction<duckdb::date_t>(&local_7c8,(LogicalType *)&stack0xfffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_7c8);
  ScalarFunction::~ScalarFunction(&local_7c8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff160);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,TIMESTAMP);
  StructDatePart::GetFunction<duckdb::timestamp_t>
            (&local_8f0,(LogicalType *)&stack0xfffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_8f0);
  ScalarFunction::~ScalarFunction(&local_8f0);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff160);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,TIME);
  StructDatePart::GetFunction<duckdb::dtime_t>(&local_a18,(LogicalType *)&stack0xfffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_a18);
  ScalarFunction::~ScalarFunction(&local_a18);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff160);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,INTERVAL);
  StructDatePart::GetFunction<duckdb::interval_t>
            (&local_b40,(LogicalType *)&stack0xfffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_b40);
  ScalarFunction::~ScalarFunction(&local_b40);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff160);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff160,TIME_TZ);
  StructDatePart::GetFunction<duckdb::dtime_tz_t>
            (&local_c68,(LogicalType *)&stack0xfffffffffffff160);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_c68);
  ScalarFunction::~ScalarFunction(&local_c68);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff160);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_d8,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_d8);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet DatePartFun::GetFunctions() {
	ScalarFunctionSet date_part;
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::DATE}, LogicalType::BIGINT,
	                                     DatePartFunction<date_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIMESTAMP}, LogicalType::BIGINT,
	                                     DatePartFunction<timestamp_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIME}, LogicalType::BIGINT,
	                                     DatePartFunction<dtime_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::INTERVAL}, LogicalType::BIGINT,
	                                     DatePartFunction<interval_t>, DatePartBind));
	date_part.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIME_TZ}, LogicalType::BIGINT,
	                                     DatePartFunction<dtime_tz_t>, DatePartBind));

	// struct variants
	date_part.AddFunction(StructDatePart::GetFunction<date_t>(LogicalType::DATE));
	date_part.AddFunction(StructDatePart::GetFunction<timestamp_t>(LogicalType::TIMESTAMP));
	date_part.AddFunction(StructDatePart::GetFunction<dtime_t>(LogicalType::TIME));
	date_part.AddFunction(StructDatePart::GetFunction<interval_t>(LogicalType::INTERVAL));
	date_part.AddFunction(StructDatePart::GetFunction<dtime_tz_t>(LogicalType::TIME_TZ));

	for (auto &func : date_part.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}

	return date_part;
}